

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.c++
# Opt level: O0

StringTree *
capnp::anon_unknown_2::print
          (StringTree *__return_storage_ptr__,Reader *value,Which which,Indent indent,PrintMode mode
          )

{
  uint *__return_storage_ptr___00;
  Field field_00;
  Field field_01;
  ReaderFor<bool> RVar1;
  bool bVar2;
  uint16_t uVar3;
  Which WVar4;
  Type TVar5;
  uint uVar6;
  uint uVar7;
  Indent indent_00;
  Array<kj::StringTree> *other;
  NullableValue<capnp::EnumSchema::Enumerant> *other_00;
  Enumerant *pEVar8;
  Field *this;
  StringTree *pSVar9;
  char (*params) [22];
  undefined8 extraout_RDX;
  undefined4 in_register_00000084;
  char *pcVar10;
  ReaderFor<capnp::DynamicEnum> RVar11;
  Iterator IVar12;
  ArrayPtr<const_char> AVar13;
  undefined1 local_8c1 [25];
  StringTree local_8a8;
  kj local_869;
  Array<kj::StringTree> local_868;
  uint local_84c;
  Field *local_848;
  Schema SStack_840;
  uint local_838;
  undefined4 uStack_834;
  SegmentReader *pSStack_830;
  CapTableReader *local_828;
  void *pvStack_820;
  WirePointer *local_818;
  StructDataBitCount SStack_810;
  StructPointerCount SStack_80c;
  undefined2 uStack_80a;
  Reader local_800;
  StringTree local_7b8;
  Reader local_780;
  ArrayPtr<const_char> local_750;
  StringTree local_740;
  Field *local_708;
  Schema SStack_700;
  uint local_6f8;
  undefined4 uStack_6f4;
  SegmentReader *pSStack_6f0;
  CapTableReader *local_6e8;
  void *pvStack_6e0;
  WirePointer *local_6d8;
  StructDataBitCount SStack_6d0;
  StructPointerCount SStack_6cc;
  undefined2 uStack_6ca;
  Field *local_6b8;
  Field *unionField;
  Field *_unionField194;
  Field field_1;
  undefined1 local_658 [8];
  Iterator __end3;
  undefined1 local_638 [8];
  Iterator __begin3;
  FieldSubset *__range3;
  Reader local_5d0;
  StringTree local_588;
  ArrayPtr<const_char> local_550;
  StringTree local_540;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined1 local_4c8 [8];
  Reader fieldProto;
  Field *field;
  Field *_field180;
  StringTree unionValue;
  Maybe<capnp::StructSchema::Field> which_2;
  Vector<kj::StringTree> printedFields;
  undefined1 local_3e0 [8];
  FieldSubset nonUnionFields;
  undefined1 local_390 [8];
  FieldSubset unionFields;
  ReaderFor<capnp::DynamicStruct> structValue;
  uint16_t local_308;
  kj local_305;
  undefined4 local_304;
  Reader local_300;
  ArrayPtr<const_char> local_2d0;
  Enumerant *local_2c0;
  Enumerant *enumerant;
  undefined1 local_270 [8];
  NullableValue<capnp::EnumSchema::Enumerant> _enumerant161;
  undefined1 local_218 [8];
  ReaderFor<capnp::DynamicEnum> enumValue;
  Array<kj::StringTree> local_200;
  StringTree local_1e8;
  kj local_1a9;
  anon_class_16_2_0bb6b726 local_1a8;
  Mapper<capnp::DynamicList::Reader_&> local_198;
  undefined1 local_190 [8];
  Array<kj::StringTree> elements;
  Which local_162;
  undefined1 local_160 [6];
  Which which_1;
  ReaderFor<capnp::DynamicList> listValue;
  String local_100;
  kj local_e1;
  ArrayPtr<const_unsigned_char> local_e0;
  undefined1 auStack_d0 [8];
  ArrayPtr<const_unsigned_char> bytes;
  String local_a9;
  String local_90;
  kj local_71;
  ArrayPtr<const_char> local_70;
  undefined1 auStack_60 [8];
  ArrayPtr<const_char> chars;
  ReaderFor<float> local_44;
  ReaderFor<unsigned_long> local_40;
  ReaderFor<long> local_38;
  char *local_30;
  PrintMode local_28;
  Which local_22;
  PrintMode mode_local;
  Which which_local;
  Reader *value_local;
  StringTree *pSStack_10;
  Indent indent_local;
  
  pcVar10 = (char *)CONCAT44(in_register_00000084,mode);
  local_28 = mode;
  local_22 = which;
  _mode_local = value;
  value_local._4_4_ = indent.amount;
  pSStack_10 = __return_storage_ptr__;
  TVar5 = DynamicValue::Reader::getType(value);
  switch(TVar5) {
  case UNKNOWN:
    kj::strTree<char_const(&)[2]>(__return_storage_ptr__,(kj *)0x4a9c01,(char (*) [2])params);
    break;
  case VOID:
    kj::strTree<char_const(&)[5]>(__return_storage_ptr__,(kj *)"void",(char (*) [5])params);
    break;
  case BOOL:
    RVar1 = DynamicValue::Reader::as<bool>(_mode_local);
    local_30 = "false";
    if (RVar1) {
      local_30 = "true";
    }
    kj::strTree<char_const*>
              (__return_storage_ptr__,(kj *)&local_30,
               (char **)CONCAT71((int7)((ulong)extraout_RDX >> 8),RVar1));
    break;
  case INT:
    local_38 = DynamicValue::Reader::as<long>(_mode_local);
    kj::strTree<long>(__return_storage_ptr__,&local_38);
    break;
  case UINT:
    local_40 = DynamicValue::Reader::as<unsigned_long>(_mode_local);
    kj::strTree<unsigned_long>(__return_storage_ptr__,&local_40);
    break;
  case FLOAT:
    if (local_22 == FLOAT32) {
      local_44 = DynamicValue::Reader::as<float>(_mode_local);
      kj::strTree<float>(__return_storage_ptr__,&local_44);
    }
    else {
      chars.size_ = (size_t)DynamicValue::Reader::as<double>(_mode_local);
      kj::strTree<double>(__return_storage_ptr__,(double *)&chars.size_);
    }
    break;
  case TEXT:
    local_70 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(_mode_local);
    _auStack_60 = kj::StringPtr::operator_cast_to_ArrayPtr((StringPtr *)&local_70);
    local_71 = (kj)0x22;
    local_a9.content._1_8_ = auStack_60;
    local_a9.content._9_8_ = chars.ptr;
    kj::encodeCEscape(&local_90,_auStack_60);
    local_a9.content.ptr._0_1_ = 0x22;
    kj::strTree<char,kj::String,char>
              (__return_storage_ptr__,&local_71,(char *)&local_90,&local_a9,pcVar10);
    kj::String::~String(&local_90);
    break;
  case DATA:
    local_e0 = (ArrayPtr<const_unsigned_char>)DynamicValue::Reader::as<capnp::Data>(_mode_local);
    _auStack_d0 = kj::ArrayPtr<const_unsigned_char>::asBytes(&local_e0);
    local_e1 = (kj)0x22;
    kj::encodeCEscape(&local_100,_auStack_d0);
    listValue.reader._47_1_ = 0x22;
    kj::strTree<char,kj::String,char>
              (__return_storage_ptr__,&local_e1,(char *)&local_100,
               (String *)&listValue.reader.field_0x2f,pcVar10);
    kj::String::~String(&local_100);
    break;
  case LIST:
    DynamicValue::Reader::as<capnp::DynamicList>
              ((ReaderFor<capnp::DynamicList> *)local_160,_mode_local);
    join_0x00000010_0x00000000_ =
         (Type)DynamicList::Reader::getSchema((ReaderFor<capnp::DynamicList> *)local_160);
    local_162 = ListSchema::whichElementType((ListSchema *)&elements.disposer);
    kj::_::Mapper<capnp::DynamicList::Reader_&>::Mapper
              (&local_198,(ReaderFor<capnp::DynamicList> *)local_160);
    local_1a8.which = &local_162;
    local_1a8.indent = (Indent *)((long)&value_local + 4);
    kj::_::Mapper<capnp::DynamicList::Reader_&>::
    operator*<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_stringify_c__:154:44)>
              ((Array<kj::StringTree> *)local_190,&local_198,&local_1a8);
    local_1a9 = (kj)0x5b;
    other = kj::mv<kj::Array<kj::StringTree>>((Array<kj::StringTree> *)local_190);
    kj::Array<kj::StringTree>::Array(&local_200,other);
    pcVar10 = (char *)0x0;
    Indent::delimit(&local_1e8,(Indent *)((long)&value_local + 4),&local_200,local_28,LIST);
    enumValue._15_1_ = 0x5d;
    kj::strTree<char,kj::StringTree,char>
              (__return_storage_ptr__,&local_1a9,(char *)&local_1e8,
               (StringTree *)&enumValue.field_0xf,pcVar10);
    kj::StringTree::~StringTree(&local_1e8);
    kj::Array<kj::StringTree>::~Array(&local_200);
    kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)local_190);
    break;
  case ENUM:
    RVar11 = DynamicValue::Reader::as<capnp::DynamicEnum>(_mode_local);
    _enumerant161.field_1._56_8_ = RVar11.schema.super_Schema.raw;
    enumValue.schema.super_Schema.raw._0_2_ = RVar11.value;
    local_218 = (undefined1  [8])_enumerant161.field_1._56_8_;
    DynamicEnum::getEnumerant
              ((Maybe<capnp::EnumSchema::Enumerant> *)&enumerant,(DynamicEnum *)local_218);
    other_00 = kj::_::readMaybe<capnp::EnumSchema::Enumerant>
                         ((Maybe<capnp::EnumSchema::Enumerant> *)&enumerant);
    kj::_::NullableValue<capnp::EnumSchema::Enumerant>::NullableValue
              ((NullableValue<capnp::EnumSchema::Enumerant> *)local_270,other_00);
    kj::Maybe<capnp::EnumSchema::Enumerant>::~Maybe
              ((Maybe<capnp::EnumSchema::Enumerant> *)&enumerant);
    pEVar8 = kj::_::NullableValue::operator_cast_to_Enumerant_((NullableValue *)local_270);
    if (pEVar8 == (Enumerant *)0x0) {
      local_305 = (kj)0x28;
      local_308 = DynamicEnum::getRaw((DynamicEnum *)local_218);
      structValue.reader._47_1_ = 0x29;
      kj::strTree<char,unsigned_short,char>
                (__return_storage_ptr__,&local_305,(char *)&local_308,
                 (unsigned_short *)&structValue.reader.field_0x2f,pcVar10);
    }
    else {
      local_2c0 = kj::_::NullableValue<capnp::EnumSchema::Enumerant>::operator*
                            ((NullableValue<capnp::EnumSchema::Enumerant> *)local_270);
      EnumSchema::Enumerant::getProto(&local_300,local_2c0);
      local_2d0 = (ArrayPtr<const_char>)capnp::schema::Enumerant::Reader::getName(&local_300);
      kj::strTree<capnp::Text::Reader>(__return_storage_ptr__,(Reader *)&local_2d0);
    }
    local_304 = 1;
    kj::_::NullableValue<capnp::EnumSchema::Enumerant>::~NullableValue
              ((NullableValue<capnp::EnumSchema::Enumerant> *)local_270);
    break;
  case STRUCT:
    __return_storage_ptr___00 = &unionFields.size_;
    DynamicValue::Reader::as<capnp::DynamicStruct>
              ((ReaderFor<capnp::DynamicStruct> *)__return_storage_ptr___00,_mode_local);
    nonUnionFields._64_8_ = DynamicStruct::Reader::getSchema((Reader *)__return_storage_ptr___00);
    StructSchema::getUnionFields((FieldSubset *)local_390,(StructSchema *)&nonUnionFields.size_);
    printedFields.builder.disposer =
         (ArrayDisposer *)DynamicStruct::Reader::getSchema((Reader *)__return_storage_ptr___00);
    StructSchema::getNonUnionFields
              ((FieldSubset *)local_3e0,(StructSchema *)&printedFields.builder.disposer);
    uVar6 = StructSchema::FieldSubset::size((FieldSubset *)local_3e0);
    uVar7 = StructSchema::FieldSubset::size((FieldSubset *)local_390);
    kj::Vector<kj::StringTree>::Vector
              ((Vector<kj::StringTree> *)&which_2.ptr.field_1.value.proto._reader.nestingLimit,
               (ulong)((uVar6 + 1) - (uint)(uVar7 == 0)));
    DynamicStruct::Reader::which
              ((Maybe<capnp::StructSchema::Field> *)&unionValue.branches.disposer,
               (Reader *)__return_storage_ptr___00);
    kj::StringTree::StringTree((StringTree *)&_field180);
    this = kj::_::readMaybe<capnp::StructSchema::Field>
                     ((Maybe<capnp::StructSchema::Field> *)&unionValue.branches.disposer);
    if (this != (Field *)0x0) {
      fieldProto._reader._40_8_ = this;
      StructSchema::Field::getProto((Reader *)local_4c8,this);
      uVar3 = capnp::schema::Field::Reader::getDiscriminantValue((Reader *)local_4c8);
      if (uVar3 == 0) {
        local_508 = *(undefined8 *)fieldProto._reader._40_8_;
        uStack_500 = *(undefined8 *)(fieldProto._reader._40_8_ + 8);
        local_4f8 = *(undefined8 *)(fieldProto._reader._40_8_ + 0x10);
        uStack_4f0 = *(undefined8 *)(fieldProto._reader._40_8_ + 0x18);
        local_4e8 = *(undefined8 *)(fieldProto._reader._40_8_ + 0x20);
        uStack_4e0 = *(undefined8 *)(fieldProto._reader._40_8_ + 0x28);
        local_4d8 = *(undefined8 *)(fieldProto._reader._40_8_ + 0x30);
        uStack_4d0 = *(undefined8 *)(fieldProto._reader._40_8_ + 0x38);
        bVar2 = DynamicStruct::Reader::has
                          ((Reader *)&unionFields.size_,*(Field *)fieldProto._reader._40_8_,NON_NULL
                          );
        if (!bVar2) {
          kj::Maybe<capnp::StructSchema::Field>::operator=
                    ((Maybe<capnp::StructSchema::Field> *)&unionValue.branches.disposer);
          goto LAB_003acf48;
        }
      }
      local_550 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)local_4c8);
      DynamicStruct::Reader::get
                (&local_5d0,(Reader *)&unionFields.size_,*(Field *)fieldProto._reader._40_8_);
      WVar4 = whichFieldType((Field *)fieldProto._reader._40_8_);
      indent_00 = Indent::next((Indent *)((long)&value_local + 4));
      pSVar9 = (StringTree *)0x1;
      print(&local_588,&local_5d0,WVar4,indent_00,PREFIXED);
      kj::strTree<capnp::Text::Reader,char_const(&)[4],kj::StringTree>
                (&local_540,(kj *)&local_550,(Reader *)" = ",(char (*) [4])&local_588,pSVar9);
      kj::StringTree::operator=((StringTree *)&_field180,&local_540);
      kj::StringTree::~StringTree(&local_540);
      kj::StringTree::~StringTree(&local_588);
      DynamicValue::Reader::~Reader(&local_5d0);
    }
LAB_003acf48:
    __begin3._8_8_ = local_3e0;
    IVar12 = StructSchema::FieldSubset::begin((FieldSubset *)__begin3._8_8_);
    __end3._8_8_ = IVar12.container;
    __begin3.container._0_4_ = IVar12.index;
    local_638 = (undefined1  [8])__end3._8_8_;
    IVar12 = StructSchema::FieldSubset::end((FieldSubset *)__begin3._8_8_);
    field_1.proto._reader._40_8_ = IVar12.container;
    __end3.container._0_4_ = IVar12.index;
    local_658 = (undefined1  [8])field_1.proto._reader._40_8_;
    while( true ) {
      bVar2 = capnp::_::
              IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>::
              operator==((IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
                          *)local_638,
                         (IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
                          *)local_658);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      capnp::_::IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
      ::operator*((Field *)&_unionField194,
                  (IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
                   *)local_638);
      unionField = kj::_::readMaybe<capnp::StructSchema::Field>
                             ((Maybe<capnp::StructSchema::Field> *)&unionValue.branches.disposer);
      if (unionField != (Field *)0x0) {
        local_6b8 = unionField;
        uVar6 = StructSchema::Field::getIndex(unionField);
        uVar7 = StructSchema::Field::getIndex((Field *)&_unionField194);
        if (uVar6 < uVar7) {
          pSVar9 = kj::mv<kj::StringTree>((StringTree *)&_field180);
          kj::Vector<kj::StringTree>::add<kj::StringTree>
                    ((Vector<kj::StringTree> *)&which_2.ptr.field_1.value.proto._reader.nestingLimit
                     ,pSVar9);
          kj::Maybe<capnp::StructSchema::Field>::operator=
                    ((Maybe<capnp::StructSchema::Field> *)&unionValue.branches.disposer);
        }
      }
      local_6d8 = field_1.proto._reader.pointers;
      SStack_6d0 = field_1.proto._reader.dataSize;
      SStack_6cc = field_1.proto._reader.pointerCount;
      uStack_6ca = field_1.proto._reader._38_2_;
      local_6e8 = field_1.proto._reader.capTable;
      pvStack_6e0 = field_1.proto._reader.data;
      local_6f8 = field_1.index;
      uStack_6f4 = field_1._12_4_;
      pSStack_6f0 = field_1.proto._reader.segment;
      local_708 = _unionField194;
      SStack_700 = field_1.parent.super_Schema.raw;
      field_00._8_8_ = field_1.parent.super_Schema.raw;
      field_00.parent.super_Schema.raw = (Schema)(Schema)_unionField194;
      field_00.proto._reader.segment = (SegmentReader *)field_1._8_8_;
      field_00.proto._reader.capTable = (CapTableReader *)field_1.proto._reader.segment;
      field_00.proto._reader.data = field_1.proto._reader.capTable;
      field_00.proto._reader.pointers = (WirePointer *)field_1.proto._reader.data;
      field_00.proto._reader._32_8_ = field_1.proto._reader.pointers;
      field_00.proto._reader.nestingLimit = field_1.proto._reader.dataSize;
      field_00.proto._reader._44_2_ = field_1.proto._reader.pointerCount;
      field_00.proto._reader._46_2_ = field_1.proto._reader._38_2_;
      bVar2 = DynamicStruct::Reader::has((Reader *)&unionFields.size_,field_00,NON_NULL);
      if (bVar2) {
        StructSchema::Field::getProto(&local_780,(Field *)&_unionField194);
        AVar13 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName(&local_780);
        local_818 = field_1.proto._reader.pointers;
        SStack_810 = field_1.proto._reader.dataSize;
        SStack_80c = field_1.proto._reader.pointerCount;
        uStack_80a = field_1.proto._reader._38_2_;
        local_828 = field_1.proto._reader.capTable;
        pvStack_820 = field_1.proto._reader.data;
        local_838 = field_1.index;
        uStack_834 = field_1._12_4_;
        pSStack_830 = field_1.proto._reader.segment;
        local_848 = _unionField194;
        SStack_840 = field_1.parent.super_Schema.raw;
        field_01._8_8_ = field_1.parent.super_Schema.raw;
        field_01.parent.super_Schema.raw = (Schema)(Schema)_unionField194;
        field_01.proto._reader.segment = (SegmentReader *)field_1._8_8_;
        field_01.proto._reader.capTable = (CapTableReader *)field_1.proto._reader.segment;
        field_01.proto._reader.data = field_1.proto._reader.capTable;
        field_01.proto._reader.pointers = (WirePointer *)field_1.proto._reader.data;
        field_01.proto._reader._32_8_ = field_1.proto._reader.pointers;
        field_01.proto._reader.nestingLimit = field_1.proto._reader.dataSize;
        field_01.proto._reader._44_2_ = field_1.proto._reader.pointerCount;
        field_01.proto._reader._46_2_ = field_1.proto._reader._38_2_;
        local_750 = AVar13;
        DynamicStruct::Reader::get(&local_800,(Reader *)&unionFields.size_,field_01);
        WVar4 = whichFieldType((Field *)&_unionField194);
        local_84c = (uint)Indent::next((Indent *)((long)&value_local + 4));
        pSVar9 = (StringTree *)0x1;
        print(&local_7b8,&local_800,WVar4,(Indent)local_84c,PREFIXED);
        kj::strTree<capnp::Text::Reader,char_const(&)[4],kj::StringTree>
                  (&local_740,(kj *)&local_750,(Reader *)" = ",(char (*) [4])&local_7b8,pSVar9);
        kj::Vector<kj::StringTree>::add<kj::StringTree>
                  ((Vector<kj::StringTree> *)&which_2.ptr.field_1.value.proto._reader.nestingLimit,
                   &local_740);
        kj::StringTree::~StringTree(&local_740);
        kj::StringTree::~StringTree(&local_7b8);
        DynamicValue::Reader::~Reader(&local_800);
      }
      capnp::_::IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
      ::operator++((IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
                    *)local_638);
    }
    bVar2 = kj::Maybe<capnp::StructSchema::Field>::operator==
                      ((Maybe<capnp::StructSchema::Field> *)&unionValue.branches.disposer);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      pSVar9 = kj::mv<kj::StringTree>((StringTree *)&_field180);
      kj::Vector<kj::StringTree>::add<kj::StringTree>
                ((Vector<kj::StringTree> *)&which_2.ptr.field_1.value.proto._reader.nestingLimit,
                 pSVar9);
    }
    if (local_28 == PARENTHESIZED) {
      kj::Vector<kj::StringTree>::releaseAsArray
                (&local_868,
                 (Vector<kj::StringTree> *)&which_2.ptr.field_1.value.proto._reader.nestingLimit);
      Indent::delimit(__return_storage_ptr__,(Indent *)((long)&value_local + 4),&local_868,local_28,
                      RECORD);
      kj::Array<kj::StringTree>::~Array(&local_868);
    }
    else {
      local_869 = (kj)0x28;
      kj::Vector<kj::StringTree>::releaseAsArray
                ((Array<kj::StringTree> *)(local_8c1 + 1),
                 (Vector<kj::StringTree> *)&which_2.ptr.field_1.value.proto._reader.nestingLimit);
      pcVar10 = (char *)0x1;
      Indent::delimit(&local_8a8,(Indent *)((long)&value_local + 4),
                      (Array<kj::StringTree> *)(local_8c1 + 1),local_28,RECORD);
      local_8c1[0] = 0x29;
      kj::strTree<char,kj::StringTree,char>
                (__return_storage_ptr__,&local_869,(char *)&local_8a8,(StringTree *)local_8c1,
                 pcVar10);
      kj::StringTree::~StringTree(&local_8a8);
      kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)(local_8c1 + 1));
    }
    local_304 = 1;
    kj::StringTree::~StringTree((StringTree *)&_field180);
    kj::Maybe<capnp::StructSchema::Field>::~Maybe
              ((Maybe<capnp::StructSchema::Field> *)&unionValue.branches.disposer);
    kj::Vector<kj::StringTree>::~Vector
              ((Vector<kj::StringTree> *)&which_2.ptr.field_1.value.proto._reader.nestingLimit);
    break;
  case CAPABILITY:
    kj::strTree<char_const(&)[22]>(__return_storage_ptr__,(kj *)"<external capability>",params);
    break;
  case ANY_POINTER:
    kj::strTree<char_const(&)[17]>
              (__return_storage_ptr__,(kj *)"<opaque pointer>",(char (*) [17])params);
    break;
  default:
    kj::_::unreachable();
  }
  return __return_storage_ptr__;
}

Assistant:

static kj::StringTree print(const DynamicValue::Reader& value,
                            schema::Type::Which which, Indent indent,
                            PrintMode mode) {
  switch (value.getType()) {
    case DynamicValue::UNKNOWN:
      return kj::strTree("?");
    case DynamicValue::VOID:
      return kj::strTree("void");
    case DynamicValue::BOOL:
      return kj::strTree(value.as<bool>() ? "true" : "false");
    case DynamicValue::INT:
      return kj::strTree(value.as<int64_t>());
    case DynamicValue::UINT:
      return kj::strTree(value.as<uint64_t>());
    case DynamicValue::FLOAT:
      if (which == schema::Type::FLOAT32) {
        return kj::strTree(value.as<float>());
      } else {
        return kj::strTree(value.as<double>());
      }
    case DynamicValue::TEXT: {
      kj::ArrayPtr<const char> chars = value.as<Text>();
      return kj::strTree('"', kj::encodeCEscape(chars), '"');
    }
    case DynamicValue::DATA: {
      // TODO(someday): Maybe data should be printed as binary literal.
      kj::ArrayPtr<const byte> bytes = value.as<Data>().asBytes();
      return kj::strTree('"', kj::encodeCEscape(bytes), '"');
    }
    case DynamicValue::LIST: {
      auto listValue = value.as<DynamicList>();
      auto which = listValue.getSchema().whichElementType();
      kj::Array<kj::StringTree> elements = KJ_MAP(element, listValue) {
        return print(element, which, indent.next(), BARE);
      };
      return kj::strTree('[', indent.delimit(kj::mv(elements), mode, PrintKind::LIST), ']');
    }
    case DynamicValue::ENUM: {
      auto enumValue = value.as<DynamicEnum>();
      KJ_IF_SOME(enumerant, enumValue.getEnumerant()) {
        return kj::strTree(enumerant.getProto().getName());
      } else {
        // Unknown enum value; output raw number.
        return kj::strTree('(', enumValue.getRaw(), ')');
      }
      break;
    }
    case DynamicValue::STRUCT: {
      auto structValue = value.as<DynamicStruct>();
      auto unionFields = structValue.getSchema().getUnionFields();
      auto nonUnionFields = structValue.getSchema().getNonUnionFields();

      kj::Vector<kj::StringTree> printedFields(nonUnionFields.size() + (unionFields.size() != 0));

      // We try to write the union field, if any, in proper order with the rest.
      auto which = structValue.which();

      kj::StringTree unionValue;
      KJ_IF_SOME(field, which) {
        // Even if the union field has its default value, if it is not the default field of the
        // union then we have to print it anyway.
        auto fieldProto = field.getProto();
        if (fieldProto.getDiscriminantValue() != 0 || structValue.has(field)) {
          unionValue = kj::strTree(
              fieldProto.getName(), " = ",
              print(structValue.get(field), whichFieldType(field), indent.next(), PREFIXED));
        } else {
          which = kj::none;
        }
      }

      for (auto field: nonUnionFields) {
        KJ_IF_SOME(unionField, which) {
          if (unionField.getIndex() < field.getIndex()) {
            printedFields.add(kj::mv(unionValue));
            which = kj::none;
          }
        }
        if (structValue.has(field)) {
          printedFields.add(kj::strTree(
              field.getProto().getName(), " = ",
              print(structValue.get(field), whichFieldType(field), indent.next(), PREFIXED)));
        }
      }
      if (which != kj::none) {
        // Union value is last.
        printedFields.add(kj::mv(unionValue));
      }

      if (mode == PARENTHESIZED) {
        return indent.delimit(printedFields.releaseAsArray(), mode, PrintKind::RECORD);
      } else {
        return kj::strTree(
            '(', indent.delimit(printedFields.releaseAsArray(), mode, PrintKind::RECORD), ')');
      }
    }
    case DynamicValue::CAPABILITY:
      return kj::strTree("<external capability>");
    case DynamicValue::ANY_POINTER:
      return kj::strTree("<opaque pointer>");
  }